

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O3

Abc_Cex_t * Abc_CexPermute(Abc_Cex_t *p,Vec_Int_t *vMapOld2New)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Abc_Cex_t *pAVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  uVar1 = vMapOld2New->nSize;
  if (uVar1 != p->nPis) {
    __assert_fail("Vec_IntSize(vMapOld2New) == p->nPis",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilCex.c"
                  ,0x1eb,"Abc_Cex_t *Abc_CexPermute(Abc_Cex_t *, Vec_Int_t *)");
  }
  iVar2 = p->iFrame;
  iVar3 = p->nRegs;
  uVar8 = (iVar2 + 1) * uVar1 + iVar3;
  pAVar4 = (Abc_Cex_t *)
           calloc(1,(long)(int)((((int)uVar8 >> 5) + 1) - (uint)((uVar8 & 0x1f) == 0)) * 4 + 0x14);
  pAVar4->nRegs = iVar3;
  pAVar4->nPis = uVar1;
  pAVar4->nBits = uVar8;
  pAVar4->iPo = p->iPo;
  pAVar4->iFrame = iVar2;
  iVar2 = p->nBits;
  if (iVar3 < iVar2) {
    iVar7 = 0;
    do {
      uVar8 = iVar3 + iVar7;
      if (((uint)(&p[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0) {
        uVar6 = (uint)((long)iVar7 % (long)(int)uVar1);
        if ((int)(uVar6 | uVar1) < 0) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = (uVar8 - uVar6) + vMapOld2New->pArray[(long)iVar7 % (long)(int)uVar1 & 0xffffffff];
        (&pAVar4[1].iPo)[iVar5 >> 5] = (&pAVar4[1].iPo)[iVar5 >> 5] | 1 << ((byte)iVar5 & 0x1f);
      }
      iVar7 = iVar7 + 1;
    } while (iVar2 - iVar3 != iVar7);
  }
  return pAVar4;
}

Assistant:

Abc_Cex_t * Abc_CexPermute( Abc_Cex_t * p, Vec_Int_t * vMapOld2New )
{
    Abc_Cex_t * pCex;
    int i, iNew;
    assert( Vec_IntSize(vMapOld2New) == p->nPis );
    pCex = Abc_CexAlloc( p->nRegs, p->nPis, p->iFrame+1 );
    pCex->iPo    = p->iPo;
    pCex->iFrame = p->iFrame;
    for ( i = p->nRegs; i < p->nBits; i++ )
        if ( Abc_InfoHasBit(p->pData, i) )
        {
            iNew = p->nRegs + p->nPis * ((i - p->nRegs) / p->nPis) + Vec_IntEntry( vMapOld2New, (i - p->nRegs) % p->nPis );
            Abc_InfoSetBit( pCex->pData, iNew );
        }
    return pCex;
}